

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error skip_literal_string(FT_Byte **acur,FT_Byte *limit)

{
  byte bVar1;
  uint uVar2;
  FT_Error FVar3;
  uint local_2c;
  FT_Error FStack_28;
  FT_Byte c;
  uint i;
  FT_Error error;
  FT_Int embed;
  FT_Byte *cur;
  FT_Byte *limit_local;
  FT_Byte **acur_local;
  
  _error = *acur;
  i = 0;
  FStack_28 = 3;
  do {
    while( true ) {
      while( true ) {
        if (limit <= _error) goto LAB_0030700d;
        bVar1 = *_error;
        _error = _error + 1;
        if (bVar1 != 0x5c) break;
        if (_error == limit) goto LAB_0030700d;
        uVar2 = *_error - 0x28;
        if (uVar2 < 0x4c || *_error == 0x74) {
          FVar3 = (*(code *)(&DAT_00381a10 + *(int *)(&DAT_00381a10 + (ulong)uVar2 * 4)))();
          return FVar3;
        }
        local_2c = 0;
        for (; ((local_2c < 3 && _error < limit && (0x2f < *_error)) && (*_error < 0x38));
            _error = _error + 1) {
          local_2c = local_2c + 1;
        }
      }
      if (bVar1 != 0x28) break;
      i = i + 1;
    }
  } while ((bVar1 != 0x29) || (i = i - 1, i != 0));
  FStack_28 = 0;
LAB_0030700d:
  *acur = _error;
  return FStack_28;
}

Assistant:

static FT_Error
  skip_literal_string( FT_Byte*  *acur,
                       FT_Byte*   limit )
  {
    FT_Byte*      cur   = *acur;
    FT_Int        embed = 0;
    FT_Error      error = FT_ERR( Invalid_File_Format );
    unsigned int  i;


    while ( cur < limit )
    {
      FT_Byte  c = *cur;


      cur++;

      if ( c == '\\' )
      {
        /* Red Book 3rd ed., section `Literal Text Strings', p. 29:     */
        /* A backslash can introduce three different types              */
        /* of escape sequences:                                         */
        /*   - a special escaped char like \r, \n, etc.                 */
        /*   - a one-, two-, or three-digit octal number                */
        /*   - none of the above in which case the backslash is ignored */

        if ( cur == limit )
          /* error (or to be ignored?) */
          break;

        switch ( *cur )
        {
          /* skip `special' escape */
        case 'n':
        case 'r':
        case 't':
        case 'b':
        case 'f':
        case '\\':
        case '(':
        case ')':
          cur++;
          break;

        default:
          /* skip octal escape or ignore backslash */
          for ( i = 0; i < 3 && cur < limit; i++ )
          {
            if ( !IS_OCTAL_DIGIT( *cur ) )
              break;

            cur++;
          }
        }
      }
      else if ( c == '(' )
        embed++;
      else if ( c == ')' )
      {
        embed--;
        if ( embed == 0 )
        {
          error = FT_Err_Ok;
          break;
        }
      }
    }

    *acur = cur;

    return error;
  }